

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O3

int AF_AActor_A_FreezeDeathChunks
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  player_t *ppVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 extraout_var;
  PClassActor *pPVar12;
  AActor *pAVar13;
  APlayerPawn *this;
  PClass *pPVar14;
  FState *pFVar15;
  AActor *ent;
  char *__assertion;
  bool bVar16;
  DVector2 v;
  FName local_6c;
  double local_68;
  double local_60;
  double local_58;
  FName local_50;
  FSoundID local_4c;
  DVector3 local_48;
  PClass *pPVar11;
  undefined4 extraout_var_00;
  
  pPVar14 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004b22eb;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004b22db:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004b22eb:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                  ,0x83,
                  "int AF_AActor_A_FreezeDeathChunks(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  ent = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (ent == (AActor *)0x0) goto LAB_004b1daa;
    pPVar11 = (ent->super_DThinker).super_DObject.Class;
    if (pPVar11 == (PClass *)0x0) {
      iVar6 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
      pPVar11 = (PClass *)CONCAT44(extraout_var,iVar6);
      (ent->super_DThinker).super_DObject.Class = pPVar11;
    }
    bVar16 = pPVar11 != (PClass *)0x0;
    if (pPVar11 != pPVar14 && bVar16) {
      do {
        pPVar11 = pPVar11->ParentClass;
        bVar16 = pPVar11 != (PClass *)0x0;
        if (pPVar11 == pPVar14) break;
      } while (pPVar11 != (PClass *)0x0);
    }
    if (!bVar16) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004b22eb;
    }
  }
  else {
    if (ent != (AActor *)0x0) goto LAB_004b22db;
LAB_004b1daa:
    ent = (AActor *)0x0;
  }
  dVar1 = (ent->Vel).X;
  if (((((dVar1 != 0.0) || (NAN(dVar1))) || (dVar1 = (ent->Vel).Y, dVar1 != 0.0)) ||
      (((NAN(dVar1) || (dVar1 = (ent->Vel).Z, dVar1 != 0.0)) || (NAN(dVar1))))) &&
     (((ent->flags6).Value & 0x20000) == 0)) {
    ent->tics = 0x69;
    return 0;
  }
  (ent->Vel).X = 0.0;
  (ent->Vel).Y = 0.0;
  (ent->Vel).Z = 0.0;
  local_4c.ID = S_FindSound("misc/icebreak");
  S_Sound(ent,4,&local_4c,1.0,1.0);
  iVar7 = (int)(ent->radius * ent->Height);
  iVar6 = iVar7 + 0x1f;
  if (-1 < iVar7) {
    iVar6 = iVar7;
  }
  uVar10 = iVar6 >> 5;
  if (iVar6 >> 5 < 5) {
    uVar10 = 4;
  }
  uVar8 = FRandom::GenRand32(&pr_freeze);
  uVar9 = FRandom::GenRand32(&pr_freeze);
  iVar7 = (int)((uVar8 & 0xff) - (uVar9 & 0xff)) % (int)(uVar10 >> 2) + uVar10;
  iVar6 = 0x18;
  if (0x18 < iVar7) {
    iVar6 = iVar7;
  }
  iVar6 = iVar6 + 1;
  do {
    uVar10 = FRandom::GenRand32(&pr_freeze);
    local_58 = (double)(int)((uVar10 & 0xff) - 0x80) * ent->radius * 0.0078125;
    uVar10 = FRandom::GenRand32(&pr_freeze);
    local_60 = (double)(int)((uVar10 & 0xff) - 0x80) * ent->radius * 0.0078125;
    uVar10 = FRandom::GenRand32(&pr_freeze);
    local_68 = ((double)(uVar10 & 0xff) * ent->Height) / 255.0;
    iVar7 = FName::NameManager::FindName(&FName::NameData,"IceChunk",false);
    P_GetOffsetPosition((ent->__Pos).X,(ent->__Pos).Y,local_58,local_60);
    local_48.Z = local_68 + (ent->__Pos).Z;
    local_6c.Index = iVar7;
    pPVar12 = ClassForSpawn(&local_6c);
    pAVar13 = AActor::StaticSpawn(pPVar12,&local_48,ALLOW_REPLACE,false);
    if (pAVar13 != (AActor *)0x0) {
      pFVar15 = pAVar13->SpawnState;
      uVar10 = FRandom::GenRand32(&pr_freeze);
      AActor::SetState(pAVar13,pFVar15 + (byte)((char)uVar10 + (char)((uVar10 & 0xff) / 3) * -3),
                       false);
      uVar10 = FRandom::GenRand32(&pr_freeze);
      uVar8 = FRandom::GenRand32(&pr_freeze);
      (pAVar13->Vel).X = (double)(int)((uVar10 & 0xff) - (uVar8 & 0xff)) * 0.0078125;
      uVar10 = FRandom::GenRand32(&pr_freeze);
      uVar8 = FRandom::GenRand32(&pr_freeze);
      dVar1 = (double)(int)((uVar10 & 0xff) - (uVar8 & 0xff)) * 0.0078125;
      dVar5 = (((pAVar13->__Pos).Z - (ent->__Pos).Z) / ent->Height) * 4.0;
      auVar3._8_4_ = SUB84(dVar5,0);
      auVar3._0_8_ = dVar1;
      auVar3._12_4_ = (int)((ulong)dVar5 >> 0x20);
      (pAVar13->Vel).Y = dVar1;
      (pAVar13->Vel).Z = (double)auVar3._8_8_;
      pAVar13->RenderStyle = ent->RenderStyle;
      pAVar13->Alpha = ent->Alpha;
    }
    iVar7 = iVar6 + -1;
    bVar16 = 0 < iVar6;
    iVar6 = iVar7;
  } while (iVar7 != 0 && bVar16);
  if (ent->player == (player_t *)0x0) goto LAB_004b228c;
  local_6c.Index = FName::NameManager::FindName(&FName::NameData,"IceChunkHead",false);
  local_48.Z = ent->player->mo->ViewHeight + (ent->__Pos).Z;
  local_48.X = (ent->__Pos).X;
  local_48.Y = (ent->__Pos).Y;
  pPVar12 = ClassForSpawn(&local_6c);
  this = (APlayerPawn *)AActor::StaticSpawn(pPVar12,&local_48,ALLOW_REPLACE,false);
  if (this == (APlayerPawn *)0x0) goto LAB_004b228c;
  uVar10 = FRandom::GenRand32(&pr_freeze);
  uVar8 = FRandom::GenRand32(&pr_freeze);
  ((DVector3 *)((DRotator *)(&(this->super_AActor).super_DThinker + 3) + 1))->X =
       (double)(int)((uVar10 & 0xff) - (uVar8 & 0xff)) * 0.0078125;
  uVar10 = FRandom::GenRand32(&pr_freeze);
  uVar8 = FRandom::GenRand32(&pr_freeze);
  dVar1 = (double)(int)((uVar10 & 0xff) - (uVar8 & 0xff)) * 0.0078125;
  dVar5 = (((pAVar13->__Pos).Z - (ent->__Pos).Z) / ent->Height) * 4.0;
  auVar4._8_4_ = SUB84(dVar5,0);
  auVar4._0_8_ = dVar1;
  auVar4._12_4_ = (int)((ulong)dVar5 >> 0x20);
  (this->super_AActor).Vel.Y = dVar1;
  (this->super_AActor).Vel.Z = (double)auVar4._8_8_;
  *(int *)((long)(&(this->super_AActor).super_DThinker + 9) + 4) = ent->health;
  (((DRotator *)(&(this->super_AActor).super_DThinker + 3))->Yaw).Degrees =
       (ent->Angles).Yaw.Degrees;
  pPVar11 = APlayerPawn::RegistrationInfo.MyClass;
  pPVar14 = (this->super_AActor).super_DThinker.super_DObject.Class;
  if (pPVar14 == (PClass *)0x0) {
    iVar6 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
    pPVar14 = (PClass *)CONCAT44(extraout_var_00,iVar6);
    (this->super_AActor).super_DThinker.super_DObject.Class = pPVar14;
  }
  bVar16 = pPVar14 != (PClass *)0x0;
  if (pPVar14 != pPVar11 && bVar16) {
    do {
      pPVar14 = pPVar14->ParentClass;
      bVar16 = pPVar14 != (PClass *)0x0;
      if (pPVar14 == pPVar11) break;
    } while (pPVar14 != (PClass *)0x0);
  }
  if (bVar16) {
    ppVar2 = ent->player;
    *(player_t **)(&(this->super_AActor).super_DThinker + 10) = ppVar2;
    ppVar2->mo = this;
    ent->player = (player_t *)0x0;
    AActor::ObtainInventory((AActor *)this,ent);
  }
  (this->super_AActor).Angles.Pitch.Degrees = 0.0;
  (this->super_AActor).RenderStyle = ent->RenderStyle;
  (this->super_AActor).Alpha = ent->Alpha;
  ppVar2 = (this->super_AActor).player;
  pAVar13 = (ppVar2->camera).field_0.p;
  if (pAVar13 == (AActor *)0x0) {
LAB_004b2277:
    pAVar13 = (AActor *)0x0;
  }
  else if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (ppVar2->camera).field_0.p = (AActor *)0x0;
    goto LAB_004b2277;
  }
  if (pAVar13 == ent) {
    (((this->super_AActor).player)->camera).field_0.p = (AActor *)this;
  }
LAB_004b228c:
  if (((ent->flags4).Value & 8) != 0) {
    A_BossDeath(ent);
  }
  A_Unblock(ent,true);
  local_50.Index = 1;
  pFVar15 = AActor::FindState(ent,&local_50);
  AActor::SetState(ent,pFVar15,false);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FreezeDeathChunks)
{
	PARAM_SELF_PROLOGUE(AActor);

	int i;
	int numChunks;
	AActor *mo;
	
	if (!self->Vel.isZero() && !(self->flags6 & MF6_SHATTERING))
	{
		self->tics = 3*TICRATE;
		return 0;
	}
	self->Vel.Zero();
	S_Sound (self, CHAN_BODY, "misc/icebreak", 1, ATTN_NORM);

	// [RH] In Hexen, this creates a random number of shards (range [24,56])
	// with no relation to the size of the self shattering. I think it should
	// base the number of shards on the size of the dead thing, so bigger
	// things break up into more shards than smaller things.
	// An actor with radius 20 and height 64 creates ~40 chunks.
	numChunks = MAX<int>(4, int(self->radius * self->Height)/32);
	i = (pr_freeze.Random2()) % (numChunks/4);
	for (i = MAX (24, numChunks + i); i >= 0; i--)
	{
		double xo = (pr_freeze() - 128)*self->radius / 128;
		double yo = (pr_freeze() - 128)*self->radius / 128;
		double zo = (pr_freeze()*self->Height / 255);

		mo = Spawn("IceChunk", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
		if (mo)
		{
			mo->SetState (mo->SpawnState + (pr_freeze()%3));
			mo->Vel.X = pr_freeze.Random2() / 128.;
			mo->Vel.Y = pr_freeze.Random2() / 128.;
			mo->Vel.Z = (mo->Z() - self->Z()) / self->Height * 4;
			mo->RenderStyle = self->RenderStyle;
			mo->Alpha = self->Alpha;
		}
	}
	if (self->player)
	{ // attach the player's view to a chunk of ice
		AActor *head = Spawn("IceChunkHead", self->PosPlusZ(self->player->mo->ViewHeight), ALLOW_REPLACE);
		if (head != NULL)
		{
			head->Vel.X = pr_freeze.Random2() / 128.;
			head->Vel.Y = pr_freeze.Random2() / 128.;
			head->Vel.Z = (mo->Z() - self->Z()) / self->Height * 4;

			head->health = self->health;
			head->Angles.Yaw = self->Angles.Yaw;
			if (head->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
			{
				head->player = self->player;
				head->player->mo = static_cast<APlayerPawn*>(head);
				self->player = NULL;
				head->ObtainInventory (self);
			}
			head->Angles.Pitch = 0.;
			head->RenderStyle = self->RenderStyle;
			head->Alpha = self->Alpha;
			if (head->player->camera == self)
			{
				head->player->camera = head;
			}
		}
	}

	// [RH] Do some stuff to make this more useful outside Hexen
	if (self->flags4 & MF4_BOSSDEATH)
	{
		A_BossDeath(self);
	}
	A_Unblock(self, true);

	self->SetState(self->FindState(NAME_Null));
	return 0;
}